

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

optional<std::basic_string_view<char,_std::char_traits<char>_>_> * __thiscall
get_param::operator()
          (optional<std::basic_string_view<char,_std::char_traits<char>_>_> *__return_storage_ptr__,
          get_param *this,int arg_position,string_view longp,string_view shortp)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  string_view str;
  string_view to_found;
  string_view str_00;
  bool bVar1;
  const_reference pvVar2;
  size_type sVar3;
  size_type sVar4;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  size_t local_88;
  char *local_80;
  size_t local_78;
  size_t local_70;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  get_param *local_58;
  size_t local_50;
  size_t local_48;
  size_t local_40;
  undefined1 local_38 [8];
  string_view arg;
  int arg_position_local;
  get_param *this_local;
  string_view longp_local;
  
  longp_local._M_len = (size_t)longp._M_str;
  this_local = (get_param *)longp._M_len;
  arg._M_str._4_4_ = arg_position;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)local_38,this->argv[arg_position]);
  this->i = arg._M_str._4_4_;
  local_48 = (size_t)local_38;
  local_40 = arg._M_len;
  local_58 = this_local;
  local_50 = longp_local._M_len;
  str_00._M_str = (char *)arg._M_len;
  str_00._M_len = (size_t)local_38;
  to_found._M_str = (char *)longp_local._M_len;
  to_found._M_len = (size_t)this_local;
  bVar1 = starts_with(str_00,to_found);
  if (bVar1) {
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_38);
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    if (sVar4 < sVar3) {
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_38,sVar3);
      if (*pvVar2 != '=') {
        sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
        pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_38,sVar3);
        if (*pvVar2 != ':') goto LAB_001149fd;
      }
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      local_68 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_38,sVar3 + 1,
                            0xffffffffffffffff);
      std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::
      optional<std::basic_string_view<char,_std::char_traits<char>_>,_true>
                (__return_storage_ptr__,&local_68);
      return __return_storage_ptr__;
    }
  }
LAB_001149fd:
  local_78 = (size_t)local_38;
  local_70 = arg._M_len;
  local_88 = shortp._M_len;
  local_80 = shortp._M_str;
  str._M_str = (char *)arg._M_len;
  str._M_len = (size_t)local_38;
  bVar1 = starts_with(str,shortp);
  if (bVar1) {
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_38);
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size(&shortp);
    if (sVar4 < sVar3) {
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(&shortp);
      local_98 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_38,sVar3,
                            0xffffffffffffffff);
      std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::
      optional<std::basic_string_view<char,_std::char_traits<char>_>,_true>
                (__return_storage_ptr__,&local_98);
      return __return_storage_ptr__;
    }
  }
  if (arg._M_str._4_4_ + 1 < this->argc) {
    __x_00._M_str = (char *)arg._M_len;
    __x_00._M_len = (size_t)local_38;
    __y._M_str = (char *)longp_local._M_len;
    __y._M_len = (size_t)this_local;
    bVar1 = std::operator==(__x_00,__y);
    if (bVar1) {
      this->i = arg._M_str._4_4_ + 1;
      std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::
      optional<const_char_*&,_true>(__return_storage_ptr__,this->argv + this->i);
      return __return_storage_ptr__;
    }
    __x._M_str = (char *)arg._M_len;
    __x._M_len = (size_t)local_38;
    bVar1 = std::operator==(__x,shortp);
    if (bVar1) {
      this->i = arg._M_str._4_4_ + 1;
      std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::
      optional<const_char_*&,_true>(__return_storage_ptr__,this->argv + this->i);
      return __return_storage_ptr__;
    }
  }
  std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::optional
            (__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

constexpr std::optional<std::string_view> operator()(
      int arg_position,
      const std::string_view longp,
      const std::string_view shortp) noexcept
    {
        std::string_view arg(argv[arg_position]);
        i = arg_position;

        if (starts_with(arg, longp) && arg.size() > longp.size() &&
            (arg[longp.size()] == '=' || arg[longp.size()] == ':'))
            return arg.substr(longp.size() + 1);

        if (starts_with(arg, shortp) && arg.size() > shortp.size())
            return arg.substr(shortp.size());

        if (arg_position + 1 < argc) {
            if (arg == longp) {
                i = arg_position + 1;
                return argv[i];
            }

            if (arg == shortp) {
                i = arg_position + 1;
                return argv[i];
            }
        }

        return std::nullopt;
    }